

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cl_half.h
# Opt level: O0

cl_float cl_half_to_float(cl_half h)

{
  ushort uVar1;
  int iVar2;
  undefined4 local_2c;
  uint32_t shift;
  uint32_t f_mant;
  uint32_t f_exp;
  int32_t exp;
  uint16_t h_mant;
  uint16_t h_exp;
  uint16_t sign;
  anon_union_4_2_947300a4 f32;
  cl_half h_local;
  
  iVar2 = (int)(uint)h >> 0xf;
  uVar1 = (ushort)((int)(uint)h >> 10) & 0x1f;
  f_exp._2_2_ = h & 0x3ff;
  shift = uVar1 + 0x70;
  if (uVar1 == 0x1f) {
    if (f_exp._2_2_ == 0) {
      f32.i = iVar2 << 0x1f | 0x7f800000;
    }
    else {
      f32.i = iVar2 << 0x1f | 0x7f800000U | (uint)f_exp._2_2_ << 0xd | 0x400000;
    }
  }
  else {
    if (((int)(uint)h >> 10 & 0x1fU) == 0) {
      if (f_exp._2_2_ == 0) {
        shift = 0;
      }
      else {
        local_2c = 0;
        for (; (f_exp._2_2_ & 0x400) == 0; f_exp._2_2_ = f_exp._2_2_ << 1) {
          local_2c = local_2c + 1;
        }
        f_exp._2_2_ = f_exp._2_2_ & 0x3ff;
        shift = shift - (local_2c + -1);
      }
    }
    f32.i = iVar2 << 0x1f | shift << 0x17 | (uint)f_exp._2_2_ << 0xd;
  }
  return f32.f;
}

Assistant:

static inline cl_float cl_half_to_float(cl_half h)
{
  // Type-punning to get direct access to underlying bits
  union
  {
    cl_float f;
    uint32_t i;
  } f32;

  // Extract sign bit
  uint16_t sign = h >> 15;

  // Extract FP16 exponent and mantissa
  uint16_t h_exp = (h >> (CL_HALF_MANT_DIG - 1)) & 0x1F;
  uint16_t h_mant = h & 0x3FF;

  // Remove FP16 exponent bias
  int32_t exp = h_exp - CL_HALF_MAX_EXP + 1;

  // Add FP32 exponent bias
  uint32_t f_exp = exp + CL_FLT_MAX_EXP - 1;

  // Check for NaN / infinity
  if (h_exp == 0x1F)
  {
    if (h_mant)
    {
      // NaN -> propagate mantissa and silence it
      uint32_t f_mant = h_mant << (CL_FLT_MANT_DIG - CL_HALF_MANT_DIG);
      f_mant |= 0x400000;
      f32.i = (sign << 31) | 0x7F800000 | f_mant;
      return f32.f;
    }
    else
    {
      // Infinity -> zero mantissa
      f32.i = (sign << 31) | 0x7F800000;
      return f32.f;
    }
  }

  // Check for zero / denormal
  if (h_exp == 0)
  {
    if (h_mant == 0)
    {
      // Zero -> zero exponent
      f_exp = 0;
    }
    else
    {
      // Denormal -> normalize it
      // - Shift mantissa to make most-significant 1 implicit
      // - Adjust exponent accordingly
      uint32_t shift = 0;
      while ((h_mant & 0x400) == 0)
      {
        h_mant <<= 1;
        shift++;
      }
      h_mant &= 0x3FF;
      f_exp -= shift - 1;
    }
  }

  f32.i = (sign << 31) | (f_exp << 23) | (h_mant << 13);
  return f32.f;
}